

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O2

void Eigen::internal::
     call_dense_assignment_loop<Eigen::Matrix<float,4,1,0,4,1>,Eigen::Product<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>const,4,3,false>,Eigen::Matrix<float,3,1,0,3,1>,1>,Eigen::internal::assign_op<float,float>>
               (Matrix<float,_4,_1,_0,_4,_1> *dst,
               Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>
               *src,assign_op<float,_float> *func)

{
  DstEvaluatorType dstEvaluator;
  Kernel kernel;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType local_80;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>
  local_78;
  SrcEvaluatorType local_58;
  
  local_58.
  super_product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhs.super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_0>.m_data =
       (src->m_lhs).
       super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
       super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_0>.m_data
  ;
  local_58.
  super_product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhs.super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
  super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_0>._8_8_ =
       *(undefined8 *)
        &(src->m_lhs).
         super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
         super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_0>.
         field_0x8;
  local_58.
  super_product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhs.super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.m_xpr =
       (src->m_lhs).
       super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
       super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.m_xpr;
  local_58.
  super_product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhs.super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.m_startRow.
  m_value = (src->m_lhs).
            super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
            super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
            m_startRow.m_value;
  local_58.
  super_product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhs.super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.m_startCol.
  m_value = (src->m_lhs).
            super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
            super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
            m_startCol.m_value;
  local_58.
  super_product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhs.super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
  super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.m_outerStride
       = (src->m_lhs).
         super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
         super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
         m_outerStride;
  local_78.m_src = &local_58;
  local_58.
  super_product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_rhs = src->m_rhs;
  local_58.
  super_product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_innerDim = 3;
  local_78.m_dst = &local_80;
  local_80.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>.m_d.data =
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>)
       (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>_>)dst;
  local_78.m_functor = func;
  local_78.m_dstExpr = dst;
  local_58.
  super_product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_lhsImpl.super_block_evaluator<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
  super_mapbase_evaluator<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_4,_3,_0,_4,_3>_>
  .m_data = local_58.
            super_product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
            .m_lhs.
            super_BlockImpl<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_Eigen::Dense>.
            super_BlockImpl_dense<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false,_true>.
            super_MapBase<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_0>.
            m_data;
  local_58.
  super_product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
  .m_rhsImpl.super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>.m_d.data
       = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>)
         (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>)
         local_58.
         super_product_evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>,_3,_Eigen::DenseShape,_Eigen::DenseShape,_float,_float>
         .m_rhs;
  copy_using_evaluator_innervec_CompleteUnrolling<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<const_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_4,_3,_false>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_1>_>,_Eigen::internal::assign_op<float,_float>,_0>,_0,_4>
  ::run(&local_78);
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE void call_dense_assignment_loop(DstXprType& dst, const SrcXprType& src, const Functor &func)
{
  typedef evaluator<DstXprType> DstEvaluatorType;
  typedef evaluator<SrcXprType> SrcEvaluatorType;

  SrcEvaluatorType srcEvaluator(src);

  // NOTE To properly handle A = (A*A.transpose())/s with A rectangular,
  // we need to resize the destination after the source evaluator has been created.
  resize_if_allowed(dst, src, func);

  DstEvaluatorType dstEvaluator(dst);

  typedef generic_dense_assignment_kernel<DstEvaluatorType,SrcEvaluatorType,Functor> Kernel;
  Kernel kernel(dstEvaluator, srcEvaluator, func, dst.const_cast_derived());

  dense_assignment_loop<Kernel>::run(kernel);
}